

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.h
# Opt level: O2

void __thiscall
lunasvg::SVGElement::
transverse<lunasvg::Document::applyStyleSheet(std::__cxx11::string_const&)::__0>
          (SVGElement *this,anon_class_8_1_a8973817 callback)

{
  pointer pRVar1;
  pointer pDVar2;
  bool bVar3;
  SVGElement *this_00;
  RuleDataList *__range3;
  Declaration *declaration;
  pointer pDVar4;
  RuleData *rule;
  pointer selector;
  _List_node_base *p_Var5;
  
  pRVar1 = ((callback.rules)->
           super__Vector_base<lunasvg::RuleData,_std::allocator<lunasvg::RuleData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (selector = ((callback.rules)->
                  super__Vector_base<lunasvg::RuleData,_std::allocator<lunasvg::RuleData>_>)._M_impl
                  .super__Vector_impl_data._M_start; selector != pRVar1; selector = selector + 1) {
    bVar3 = matchSelector(&selector->m_selector,this);
    if (bVar3) {
      pDVar2 = (selector->m_declarations).
               super__Vector_base<lunasvg::Declaration,_std::allocator<lunasvg::Declaration>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pDVar4 = (selector->m_declarations).
                    super__Vector_base<lunasvg::Declaration,_std::allocator<lunasvg::Declaration>_>.
                    _M_impl.super__Vector_impl_data._M_start; pDVar4 != pDVar2; pDVar4 = pDVar4 + 1)
      {
        setAttribute(this,pDVar4->specificity,pDVar4->id,&pDVar4->value);
      }
    }
  }
  p_Var5 = (_List_node_base *)&this->m_children;
  while (p_Var5 = (((_List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
                     *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)&this->m_children) {
    this_00 = toSVGElement((unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *)
                           (p_Var5 + 1));
    if (this_00 != (SVGElement *)0x0) {
      transverse<lunasvg::Document::applyStyleSheet(std::__cxx11::string_const&)::__0>
                (this_00,callback);
    }
  }
  return;
}

Assistant:

inline void SVGElement::transverse(T callback)
{
    callback(this);
    for(const auto& child : m_children) {
        if(auto element = toSVGElement(child)) {
            element->transverse(callback);
        }
    }
}